

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Cartridge.c
# Opt level: O1

int gb_load_rom(GameboyRom *rom,char *path)

{
  size_t __size;
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uint8_t *__ptr;
  int *piVar3;
  char *pcVar4;
  
  __stream = fopen(path,"r");
  if (__stream != (FILE *)0x0) {
    fseek(__stream,0,2);
    sVar2 = ftell(__stream);
    rom->size = sVar2;
    fseek(__stream,0,0);
    __size = rom->size;
    __ptr = (uint8_t *)malloc(__size);
    rom->data = __ptr;
    fread(__ptr,1,__size,__stream);
    iVar1 = fclose(__stream);
    return iVar1;
  }
  piVar3 = __errno_location();
  pcVar4 = strerror(*piVar3);
  printf("ERROR\tOpening file\t%s\n",pcVar4);
  return 1;
}

Assistant:

int gb_load_rom(GameboyRom* rom, const char* path) {

    FILE* rom_file;
    rom_file = fopen(path, "r");
    if(!rom_file) {
        printf("ERROR\tOpening file\t%s\n", strerror(errno));
        return 1;
    }

    fseek(rom_file, 0, SEEK_END);
    rom->size = ftell(rom_file);
    fseek(rom_file, 0, SEEK_SET);

    rom->data = malloc(rom->size * sizeof(uint8_t));
    fread(rom->data, sizeof(uint8_t), rom->size, rom_file);

    return fclose(rom_file);
}